

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_modelHHWithDifference_Test::TestBody(Equality_modelHHWithDifference_Test *this)

{
  string *psVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ModelPtr clonedModel;
  VariablePtr v;
  ModelPtr model;
  ParserPtr parser;
  AssertionResult local_a8;
  long local_98 [2];
  long *local_88;
  AssertHelper local_80 [8];
  byte local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  shared_ptr *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  long local_58 [2];
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_68 = (shared_ptr *)local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_a8);
  libcellml::Parser::parseModel((string *)&local_38);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_68 != (shared_ptr *)local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = (shared_ptr *)0x0;
  local_48 = (string *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_68,
             (unsigned_long *)&local_48);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3a4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (((local_68 != (shared_ptr *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')
        ) && (local_68 != (shared_ptr *)0x0)) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Model::clone();
  libcellml::ComponentEntity::component((ulong)local_78);
  libcellml::ComponentEntity::component((ulong)&local_a8);
  libcellml::Component::variable((ulong)&local_48);
  if (local_a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
  }
  if (local_70.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.ptr_);
  }
  psVar1 = local_48;
  local_a8._0_8_ = (shared_ptr *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"millisecond","");
  libcellml::Variable::setUnits(psVar1);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_68;
  local_a8.message_.ptr_ = local_60;
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_60->_M_string_length = (int)local_60->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_60->_M_string_length = (int)local_60->_M_string_length + 1;
    }
  }
  bVar3 = libcellml::Entity::equals(local_38);
  local_78[0] = bVar3 ^ 1;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar3 != 0) goto LAB_00121e4a;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if ((local_78[0] & 1) == 0) {
LAB_00121e4a:
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(char *)local_78,"model->equals(clonedModel)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x3ab,(char *)local_a8._0_8_);
      testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_80);
      if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
        operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
      }
      if (((local_88 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = local_38;
  local_a8.message_.ptr_ = local_30;
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
    }
  }
  bVar3 = libcellml::Entity::equals(local_68);
  local_78[0] = bVar3 ^ 1;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar3 == 0) goto LAB_00122005;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if ((local_78[0] & 1) != 0) goto LAB_00122005;
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_a8,(char *)local_78,"clonedModel->equals(model)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x3ac,(char *)local_a8._0_8_);
  testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(local_80);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (((local_88 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_88 != (long *)0x0)) {
    (**(code **)(*local_88 + 8))();
  }
LAB_00122005:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Equality, modelHHWithDifference)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    auto v = clonedModel->component(3)->component(0)->variable(3);
    v->setUnits("millisecond");

    EXPECT_FALSE(model->equals(clonedModel));
    EXPECT_FALSE(clonedModel->equals(model));
}